

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::createDFDPackedTest3_FormatRGB565_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::createDFDPackedTest3_FormatRGB565_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x58);
  Test::Test(this_00);
  this_00[1]._vptr_Test = (_func_int **)0x48000200000000;
  this_00[2]._vptr_Test = (_func_int **)0x2;
  *(undefined4 *)
   ((long)&this_00[1].gtest_flag_saver_._M_t.
           super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
           .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl + 4) = 0;
  this_00->_vptr_Test = (_func_int **)&PTR__Test_00184558;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }